

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

SourceContextInfo * __thiscall
Js::ScriptContext::CreateSourceContextInfo
          (ScriptContext *this,DWORD_PTR sourceContext,char16 *url,size_t len,
          SimpleDataCacheWrapper *dataCacheWrapper,char16 *sourceMapUrl,size_t sourceMapUrlLen)

{
  code *pcVar1;
  DWORD_PTR DVar2;
  bool bVar3;
  uint uVar4;
  SourceContextInfo *pSVar5;
  undefined4 *puVar6;
  Recycler *alloc;
  char16 *pcVar7;
  SourceDynamicProfileManager *pSVar8;
  CriticalSection *this_00;
  char *addr;
  undefined1 local_78 [8];
  TrackAllocData data;
  DWORD_PTR local_40;
  DWORD_PTR sourceContext_local;
  SourceContextInfo *sourceContextInfo;
  
  this_00 = &this->threadContext->csFunctionBody;
  data._32_8_ = len;
  local_40 = sourceContext;
  CCLock::Enter(&this_00->super_CCLock);
  EnsureSourceContextInfoMap(this);
  pSVar5 = GetSourceContextInfo(this,local_40,dataCacheWrapper);
  if (pSVar5 != (SourceContextInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xbe4,
                                "(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr)"
                                ,
                                "this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr"
                               );
    if (!bVar3) goto LAB_00797a3e;
    *puVar6 = 0;
  }
  local_78 = (undefined1  [8])&SourceContextInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d86450;
  data.filename._0_4_ = 0xbe5;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
  sourceContext_local = (DWORD_PTR)new<Memory::Recycler>(0x38,alloc,0x572640);
  *(undefined8 *)(sourceContext_local + 0x30) = 0;
  uVar4 = GetNextSourceContextId(this);
  *(uint *)sourceContext_local = uVar4;
  *(DWORD_PTR *)(sourceContext_local + 0x10) = local_40;
  *(undefined1 *)(sourceContext_local + 0x18) = 0;
  *(undefined8 *)(sourceContext_local + 0x30) = 0;
  if (url != (char16 *)0x0) {
    pcVar7 = CopyString(url,data._32_8_,&this->sourceCodeAllocator);
    *(char16 **)(sourceContext_local + 0x20) = pcVar7;
  }
  if (sourceMapUrlLen != 0 && sourceMapUrl != (char16 *)0x0) {
    pcVar7 = CopyString(sourceMapUrl,sourceMapUrlLen,&this->sourceCodeAllocator);
    *(char16 **)(sourceContext_local + 0x28) = pcVar7;
  }
  if (this->startupComplete == false) {
    pSVar8 = SourceDynamicProfileManager::LoadFromDynamicProfileStorage
                       ((SourceContextInfo *)sourceContext_local,this,dataCacheWrapper);
    addr = (char *)(sourceContext_local + 0x30);
    Memory::Recycler::WBSetBit(addr);
    *(SourceDynamicProfileManager **)addr = pSVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if (*(long *)(sourceContext_local + 0x30) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xbfb,
                                  "(sourceContextInfo->sourceDynamicProfileManager != __null)",
                                  "sourceContextInfo->sourceDynamicProfileManager != NULL");
      if (!bVar3) {
LAB_00797a3e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  JsUtil::
  BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(((this->super_ScriptContextBase).javascriptLibrary)->cache).sourceContextInfoMap.
                ptr,&local_40,(SourceContextInfo **)&sourceContext_local);
  DVar2 = sourceContext_local;
  CCLock::Leave(&this_00->super_CCLock);
  return (SourceContextInfo *)DVar2;
}

Assistant:

SourceContextInfo * ScriptContext::CreateSourceContextInfo(DWORD_PTR sourceContext, char16 const * url, size_t len,
        SimpleDataCacheWrapper* dataCacheWrapper, char16 const * sourceMapUrl /*= NULL*/, size_t sourceMapUrlLen /*= 0*/)
    {
        // Take etw rundown lock on this thread context. We are going to init/add to sourceContextInfoMap.
        AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());

        EnsureSourceContextInfoMap();
        Assert(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr);
        SourceContextInfo * sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->sourceContextId = this->GetNextSourceContextId();
        sourceContextInfo->dwHostSourceContext = sourceContext;
        sourceContextInfo->isHostDynamicDocument = false;
#if ENABLE_PROFILE_INFO
        sourceContextInfo->sourceDynamicProfileManager = nullptr;
#endif

        if (url != nullptr)
        {
            sourceContextInfo->url = CopyString(url, len, this->SourceCodeAllocator());
            JS_ETW(EtwTrace::LogSourceModuleLoadEvent(this, sourceContext, url));
        }
        if (sourceMapUrl != nullptr && sourceMapUrlLen != 0)
        {
            sourceContextInfo->sourceMapUrl = CopyString(sourceMapUrl, sourceMapUrlLen, this->SourceCodeAllocator());
        }

#if ENABLE_PROFILE_INFO
        if (!this->startupComplete)
        {
            sourceContextInfo->sourceDynamicProfileManager = SourceDynamicProfileManager::LoadFromDynamicProfileStorage(sourceContextInfo, this, dataCacheWrapper);
            Assert(sourceContextInfo->sourceDynamicProfileManager != NULL);
        }

        this->Cache()->sourceContextInfoMap->Add(sourceContext, sourceContextInfo);
#endif
        return sourceContextInfo;
    }